

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
PreventExtensions(SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                  *this,DynamicObject *instance)

{
  int iVar1;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar2;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_local;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  iVar1 = (*(pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar2,instance);
  return iVar1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::PreventExtensions(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if ((this->GetFlags() & IsExtensibleFlag) == 0)
            {
                // Already not extensible => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked())
            {
                // If the type is not shared with others, we can just change it by itself.
                return PreventExtensionsInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }